

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O2

void __thiscall
t_go_generator::generate_go_equals
          (t_go_generator *this,ostream *out,t_type *ori_type,string *tgt,string *src)

{
  uint uVar1;
  int iVar2;
  t_type *ttype;
  ostream *poVar3;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  t_type *ttype_00;
  string *this_00;
  undefined1 auVar5 [12];
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ttype = t_type::get_true_type(ori_type);
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[4])(ttype);
  if ((char)iVar2 != '\0') {
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x20);
    std::operator+(pbVar4,"compiler error: cannot generate equals for void type: ",tgt);
LAB_001c6947:
    __cxa_throw(pbVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xb])(ttype);
  if (((char)iVar2 != '\0') ||
     (iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xc])(ttype), (char)iVar2 != '\0')) {
    std::__cxx11::string::string((string *)&local_90,(string *)tgt);
    std::__cxx11::string::string((string *)&local_b0,(string *)src);
    generate_go_equals_struct(this,out,ttype_00,&local_90,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    this_00 = &local_90;
LAB_001c679c:
    std::__cxx11::string::~string((string *)this_00);
    return;
  }
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xd])(ttype);
  if ((char)iVar2 != '\0') {
    std::__cxx11::string::string((string *)&local_d0,(string *)tgt);
    std::__cxx11::string::string((string *)&local_f0,(string *)src);
    generate_go_equals_container(this,out,ttype,&local_d0,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    this_00 = &local_d0;
    goto LAB_001c679c;
  }
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
  if (((char)iVar2 == '\0') &&
     (iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype), (char)iVar2 == '\0')) {
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __cxa_allocate_exception(0x20);
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
    std::operator+(&local_70,"compiler error: Invalid type in generate_go_equals \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var,iVar2));
    std::operator+(&local_50,&local_70,"\' for \'");
    std::operator+(&local_110,&local_50,tgt);
    std::operator+(pbVar4,&local_110,"\'");
    __cxa_throw(pbVar4,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  t_generator::indent_abi_cxx11_(&local_110,&this->super_t_generator);
  poVar3 = std::operator<<(out,(string *)&local_110);
  std::operator<<(poVar3,"if ");
  std::__cxx11::string::~string((string *)&local_110);
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[10])(ttype);
    if ((char)iVar2 == '\0') goto LAB_001c6907;
  }
  else {
    uVar1 = *(uint *)&ttype[1].super_t_doc._vptr_t_doc;
    if (5 < uVar1 - 2) {
      if (uVar1 != 1) {
        if (uVar1 != 0) {
          auVar5 = __cxa_allocate_exception(0x20);
          t_base_type::t_base_name_abi_cxx11_(&local_110,(t_base_type *)(ulong)uVar1,auVar5._8_4_);
          std::operator+(auVar5._0_8_,"compiler error: no Go name for base type ",&local_110);
          __cxa_throw(auVar5._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
        pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __cxa_allocate_exception(0x20);
        std::operator+(pbVar4,"compiler error: cannot equals void: ",tgt);
        goto LAB_001c6947;
      }
      iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[7])(ttype);
      if ((char)iVar2 != '\0') {
        poVar3 = std::operator<<(out,"bytes.Compare(");
        poVar3 = std::operator<<(poVar3,(string *)tgt);
        poVar3 = std::operator<<(poVar3,", ");
        poVar3 = std::operator<<(poVar3,(string *)src);
        std::operator<<(poVar3,") != 0");
        goto LAB_001c6907;
      }
    }
  }
  poVar3 = std::operator<<(out,(string *)tgt);
  poVar3 = std::operator<<(poVar3," != ");
  std::operator<<(poVar3,(string *)src);
LAB_001c6907:
  poVar3 = std::operator<<(out," { return false }");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_go_generator::generate_go_equals(ostream& out, t_type* ori_type, string tgt, string src) {

  t_type* ttype = get_true_type(ori_type);
  // Do nothing for void types
  if (ttype->is_void()) {
    throw "compiler error: cannot generate equals for void type: " + tgt;
  }

  if (ttype->is_struct() || ttype->is_xception()) {
    generate_go_equals_struct(out, ttype, tgt, src);
  } else if (ttype->is_container()) {
    generate_go_equals_container(out, ttype, tgt, src);
  } else if (ttype->is_base_type() || ttype->is_enum()) {
    out << indent() << "if ";
    if (ttype->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)ttype)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
        throw "compiler error: cannot equals void: " + tgt;
        break;

      case t_base_type::TYPE_STRING:
        if (ttype->is_binary()) {
          out << "bytes.Compare(" << tgt << ", " << src << ") != 0";
        } else {
          out << tgt << " != " << src;
        }
        break;

      case t_base_type::TYPE_BOOL:
      case t_base_type::TYPE_I8:
      case t_base_type::TYPE_I16:
      case t_base_type::TYPE_I32:
      case t_base_type::TYPE_I64:
      case t_base_type::TYPE_DOUBLE:
        out << tgt << " != " << src;
        break;

      default:
        throw "compiler error: no Go name for base type " + t_base_type::t_base_name(tbase);
      }
    } else if (ttype->is_enum()) {
      out << tgt << " != " << src;
    }

    out << " { return false }" << endl;
  } else {
    throw "compiler error: Invalid type in generate_go_equals '" + ttype->get_name() + "' for '"
        + tgt + "'";
  }
}